

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O0

void trt_pose::parse::munkresStep4
               (PairGraph *star_graph,PairGraph *prime_graph,CoverTable *cover_table,
               pair<int,_int> p)

{
  bool bVar1;
  int local_40;
  pair<int,_int> local_3c;
  int local_34;
  pair<int,_int> local_30;
  pair<int,_int> s;
  CoverTable *cover_table_local;
  PairGraph *prime_graph_local;
  PairGraph *star_graph_local;
  pair<int,_int> p_local;
  
  s = (pair<int,_int>)cover_table;
  star_graph_local = (PairGraph *)p;
  while( true ) {
    bVar1 = utils::PairGraph::isColSet(star_graph,star_graph_local._4_4_);
    if (!bVar1) break;
    local_34 = utils::PairGraph::rowForCol(star_graph,star_graph_local._4_4_);
    std::pair<int,_int>::pair<int,_int_&,_true>
              (&local_30,&local_34,(int *)((long)&star_graph_local + 4));
    utils::PairGraph::reset(star_graph,local_30.first,local_30.second);
    utils::PairGraph::set(star_graph,(int)star_graph_local,star_graph_local._4_4_);
    local_40 = utils::PairGraph::colForRow(prime_graph,local_30.first);
    std::pair<int,_int>::pair<int_&,_int,_true>(&local_3c,&local_30.first,&local_40);
    std::pair<int,_int>::operator=((pair<int,_int> *)&star_graph_local,&local_3c);
  }
  utils::PairGraph::set(star_graph,(int)star_graph_local,star_graph_local._4_4_);
  utils::CoverTable::clear((CoverTable *)s);
  utils::PairGraph::clear(prime_graph);
  return;
}

Assistant:

void munkresStep4(PairGraph &star_graph, PairGraph &prime_graph,
                  CoverTable &cover_table, std::pair<int, int> p) {
  // repeat until no star found in prime's column
  while (star_graph.isColSet(p.second)) {
    // find and reset star in prime's column
    std::pair<int, int> s = {star_graph.rowForCol(p.second), p.second};
    star_graph.reset(s.first, s.second);

    // set this prime to a star
    star_graph.set(p.first, p.second);

    // repeat for prime in cleared star's row
    p = {s.first, prime_graph.colForRow(s.first)};
  }
  star_graph.set(p.first, p.second);
  cover_table.clear();
  prime_graph.clear();
}